

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guest-random.c
# Opt level: O3

void qemu_guest_random_seed_thread_part2(uint64_t seed)

{
  long *plVar1;
  GRand *pGVar2;
  guint32 local_10 [2];
  
  plVar1 = (long *)__tls_get_addr(&PTR_010f6bb8);
  if (*plVar1 == 0) {
    pGVar2 = g_rand_new_with_seed_array(local_10,2);
    *plVar1 = (long)pGVar2;
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/util/guest-random.c"
             ,0x49,"thread_rand == NULL");
}

Assistant:

void qemu_guest_random_seed_thread_part2(uint64_t seed)
{
#ifndef _MSC_VER
    g_assert(thread_rand == NULL);
    if (deterministic) {
        thread_rand =
            g_rand_new_with_seed_array((const guint32 *)&seed,
                                       sizeof(seed) / sizeof(guint32));
    }
#endif
}